

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_step_vec4(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float local_38 [4];
  undefined8 local_28;
  float local_20;
  float local_1c;
  Vector<float,_4> res;
  
  local_28 = *(undefined8 *)(c->in[0].m_data + 1);
  local_20 = c->in[0].m_data[3];
  local_1c = c->in[0].m_data[0];
  local_38[0] = c->in[1].m_data[3];
  local_38[1] = c->in[1].m_data[2];
  local_38[2] = c->in[1].m_data[1];
  local_38[3] = c->in[1].m_data[0];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] =
         (float)(~-(uint)(local_38[lVar1] < *(float *)((long)&local_28 + lVar1 * 4)) & 0x3f800000);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(undefined8 *)(c->color).m_data = res.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res.m_data._8_8_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }